

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

Real M_GetEl(Matrix *M,size_t Row,size_t Clm)

{
  LASErrIdType LVar1;
  ElType *local_40;
  ElType *PtrEl;
  size_t ElCount;
  size_t Len;
  Real Val;
  size_t Clm_local;
  size_t Row_local;
  Matrix *M_local;
  
  LVar1 = LASResult();
  if (LVar1 == LASOK) {
    if ((((Row == 0) || (M->RowDim < Row)) || (Clm == 0)) || (M->ClmDim < Clm)) {
      LASError(LASRangeErr,"M_GetEl",M->Name,(char *)0x0,(char *)0x0);
      Len = 0;
    }
    else {
      Len = 0;
      if (M->ElOrder == Rowws) {
        local_40 = M->El[Row];
        for (PtrEl = (ElType *)M->Len[Row]; PtrEl != (ElType *)0x0;
            PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
          if (local_40->Pos == Clm) {
            Len = (size_t)local_40->Val;
          }
          local_40 = local_40 + 1;
        }
      }
      else if (M->ElOrder == Clmws) {
        local_40 = M->El[Clm];
        for (PtrEl = (ElType *)M->Len[Clm]; PtrEl != (ElType *)0x0;
            PtrEl = (ElType *)((long)&PtrEl[-1].Val + 7)) {
          if (local_40->Pos == Row) {
            Len = (size_t)local_40->Val;
          }
          local_40 = local_40 + 1;
        }
      }
    }
  }
  else {
    Len = 0;
  }
  return (Real)Len;
}

Assistant:

Real M_GetEl(Matrix *M, size_t Row, size_t Clm)
/* returns the value of a matrix element (all matrix elements are considered) */
{
    Real Val;
    
    size_t Len, ElCount;
    ElType *PtrEl;

    if (LASResult() == LASOK) {
        if (Row > 0 && Row <= M->RowDim && Clm > 0 && Clm <= M->ClmDim) {
            Val = 0.0;
            if (M->ElOrder == Rowws) {
                Len = M->Len[Row];
                PtrEl = M->El[Row];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Clm)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            } else if (M->ElOrder == Clmws) {
                Len = M->Len[Clm];
                PtrEl = M->El[Clm];
                for (ElCount = Len; ElCount > 0; ElCount--) {
                    if ((*PtrEl).Pos == Row)
                        Val = (*PtrEl).Val;
                    PtrEl++;
                }
            }
        } else {
            LASError(LASRangeErr, "M_GetEl", M->Name, NULL, NULL);
            Val = 0.0;
        }
    } else {
        Val = 0.0;
    }
    return(Val);
}